

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseList(TidyDocImpl *doc,Node *list,GetTokenMode mode)

{
  char cVar1;
  TidyParserMemory data;
  Bool BVar2;
  char *property;
  bool bVar3;
  bool local_c1;
  code *pcStack_c0;
  TidyParserMemory memory_1;
  uint ix;
  uint ch;
  Bool foundLI;
  TidyParserMemory memory;
  Bool nodeisOL;
  Bool wasblock;
  Node *lastli;
  Node *parent;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *list_local;
  TidyDocImpl *doc_local;
  
  node = (Node *)doc->lexer;
  parent = (Node *)0x0;
  lastli = (Node *)0x0;
  _nodeisOL = (Node *)0x0;
  memory._44_4_ = 0;
  local_c1 = false;
  if ((list != (Node *)0x0) && (local_c1 = false, list->tag != (Dict *)0x0)) {
    local_c1 = list->tag->id == TidyTag_OL;
  }
  memory.register_2 = (int)local_c1;
  lexer._4_4_ = mode;
  pNStack_20 = list;
  list_local = &doc->root;
  if (list == (Node *)0x0) {
    prvTidypopMemory((TidyParserMemory *)&ch,doc);
    parent = memory.original_node;
    pNStack_20 = (Node *)memory.identity;
    lexer._4_4_ = memory.reentry_mode;
  }
  else if ((list->tag->model & 1) != 0) {
    return (Node *)0x0;
  }
  node[1].next = (Node *)0x0;
  do {
    while( true ) {
      while( true ) {
        do {
          parent = prvTidyGetToken((TidyDocImpl *)list_local,IgnoreWhitespace);
          if (parent == (Node *)0x0) {
            prvTidyReport((TidyDocImpl *)list_local,pNStack_20,(Node *)0x0,0x25a);
            return (Node *)0x0;
          }
          ix = 0;
          if ((parent->tag == pNStack_20->tag) && (parent->type == EndTag)) {
            prvTidyFreeNode((TidyDocImpl *)list_local,parent);
            pNStack_20->closed = yes;
            return (Node *)0x0;
          }
          BVar2 = InsertMisc(pNStack_20,parent);
        } while (BVar2 != no);
        if ((parent->type == TextNode) || (parent->tag != (Dict *)0x0)) break;
        prvTidyReport((TidyDocImpl *)list_local,pNStack_20,parent,0x235);
        prvTidyFreeNode((TidyDocImpl *)list_local,parent);
      }
      if ((node != (Node *)0x0) && (parent->type == TextNode)) break;
LAB_00147301:
      if (parent->type != EndTag) {
        if ((((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
            (parent->tag->id != TidyTag_LI)) && (memory.register_2 != 0)) {
          ix = FindLastLI(pNStack_20,(Node **)&nodeisOL);
        }
        if ((((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
            (parent->tag->id != TidyTag_LI)) &&
           ((BVar2 = prvTidyIsHTML5Mode((TidyDocImpl *)list_local), BVar2 == no || (ix != 0)))) {
          prvTidyUngetToken((TidyDocImpl *)list_local);
          BVar2 = prvTidynodeHasCM(parent,8);
          if ((BVar2 != no) && (*(int *)((long)&node->next + 4) != 0)) {
            prvTidyReport((TidyDocImpl *)list_local,pNStack_20,parent,0x259);
            return (Node *)0x0;
          }
          if ((*(int *)&node->content != 0) &&
             ((BVar2 = prvTidynodeHasCM(parent,0x380), BVar2 != no ||
              (((parent != (Node *)0x0 && (parent->tag != (Dict *)0x0)) &&
               (parent->tag->id == TidyTag_TABLE)))))) {
            return (Node *)0x0;
          }
          if (((pNStack_20 == (Node *)0x0) || (pNStack_20->tag == (Dict *)0x0)) ||
             ((pNStack_20->tag->id != TidyTag_OL ||
              (BVar2 = FindLastLI(pNStack_20,(Node **)&nodeisOL), BVar2 == no)))) {
            memory._44_4_ = prvTidynodeHasCM(parent,8);
            parent = prvTidyInferredTag((TidyDocImpl *)list_local,TidyTag_LI);
            property = "list-style: none";
            if (memory._44_4_ != 0) {
              property = "list-style: none; display: inline";
            }
            prvTidyAddStyleProperty((TidyDocImpl *)list_local,parent,property);
            prvTidyReport((TidyDocImpl *)list_local,pNStack_20,parent,0x261);
            prvTidyInsertNodeAtEnd(pNStack_20,parent);
          }
          else {
            parent = prvTidyInferredTag((TidyDocImpl *)list_local,TidyTag_LI);
            prvTidyReport((TidyDocImpl *)list_local,pNStack_20,parent,0x261);
            prvTidyFreeNode((TidyDocImpl *)list_local,parent);
            parent = _nodeisOL;
          }
        }
        else {
          prvTidyInsertNodeAtEnd(pNStack_20,parent);
        }
        memset(&pcStack_c0,0,0x30);
        pcStack_c0 = prvTidyParseList;
        memory_1.identity = (Parser *)pNStack_20;
        memory_1.original_node = parent;
        memory_1.reentry_mode = IgnoreWhitespace;
        data.original_node = pNStack_20;
        data.identity = prvTidyParseList;
        data.reentry_node = parent;
        data._24_8_ = memory_1.reentry_node;
        data.mode = (int)((ulong)(uint)memory_1.reentry_state << 0x20);
        data.register_1 = (int)(((ulong)(uint)memory_1.reentry_state << 0x20) >> 0x20);
        data.register_2 = memory_1.mode;
        data._44_4_ = memory_1.register_1;
        prvTidypushMemory((TidyDocImpl *)list_local,data);
        return parent;
      }
      if (((parent == (Node *)0x0) || (parent->tag == (Dict *)0x0)) ||
         (parent->tag->id != TidyTag_FORM)) {
        BVar2 = prvTidynodeHasCM(parent,0x10);
        if (BVar2 == no) {
          lastli = pNStack_20->parent;
          while ((lastli != (Node *)0x0 &&
                 (((lastli == (Node *)0x0 || (lastli->tag == (Dict *)0x0)) ||
                  (lastli->tag->id != TidyTag_BODY))))) {
            if (parent->tag == lastli->tag) {
              prvTidyReport((TidyDocImpl *)list_local,pNStack_20,parent,0x259);
              prvTidyUngetToken((TidyDocImpl *)list_local);
              return (Node *)0x0;
            }
            lastli = lastli->parent;
          }
          prvTidyReport((TidyDocImpl *)list_local,pNStack_20,parent,0x235);
          prvTidyFreeNode((TidyDocImpl *)list_local,parent);
        }
        else {
          prvTidyReport((TidyDocImpl *)list_local,pNStack_20,parent,0x235);
          prvTidyPopInline((TidyDocImpl *)list_local,parent);
          prvTidyFreeNode((TidyDocImpl *)list_local,parent);
        }
      }
      else {
        BadForm((TidyDocImpl *)list_local);
        prvTidyReport((TidyDocImpl *)list_local,pNStack_20,parent,0x235);
        prvTidyFreeNode((TidyDocImpl *)list_local,parent);
      }
    }
    memory_1._44_4_ = parent->start;
    while( true ) {
      bVar3 = false;
      if ((uint)memory_1._44_4_ < parent->end) {
        cVar1 = *(char *)(*(long *)&node->linebreak + (ulong)(uint)memory_1._44_4_);
        bVar3 = false;
        if ((((cVar1 != '\0') && (bVar3 = true, cVar1 != ' ')) && (bVar3 = true, cVar1 != '\t')) &&
           (bVar3 = true, cVar1 != '\r')) {
          bVar3 = cVar1 == '\n';
        }
      }
      if (!bVar3) break;
      memory_1._44_4_ = memory_1._44_4_ + 1;
    }
    if ((uint)memory_1._44_4_ < parent->end) goto LAB_00147301;
    prvTidyFreeNode((TidyDocImpl *)list_local,parent);
  } while( true );
}

Assistant:

Node* TY_(ParseList)( TidyDocImpl* doc, Node *list, GetTokenMode ARG_UNUSED(mode) )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Node *parent = NULL;
    Node *lastli = NULL;;
    Bool wasblock = no;
    Bool nodeisOL = nodeIsOL(list);
    DEBUG_LOG_COUNTERS;

    if ( list == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, as main loop overrwrites anyway. */
        DEBUG_LOG_REENTER_WITH_NODE(node);
        list = memory.original_node;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(list);

        if (list->tag->model & CM_EMPTY)
        {
            DEBUG_LOG_EXIT;
            return NULL;
        }
    }
    
    lexer->insert = NULL;  /* defer implicit inline start tags */

    while ((node = TY_(GetToken)( doc, IgnoreWhitespace)) != NULL)
    {
        Bool foundLI = no;
        if (node->tag == list->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            list->closed = yes;
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(list, node))
            continue;

        if (node->type != TextNode && node->tag == NULL)
        {
            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }
        if (lexer && (node->type == TextNode))
        {
            uint ch, ix = node->start;
            /* Issue #572 - Skip whitespace. */
            while (ix < node->end && (ch = (lexer->lexbuf[ix] & 0xff))
                && (ch == ' ' || ch == '\t' || ch == '\r' || ch == '\n'))
                ++ix;
            if (ix >= node->end)
            {
                /* Issue #572 - Discard if ALL whitespace. */
                TY_(FreeNode)(doc, node);
                continue;
            }
        }


        /*
          if this is the end tag for an ancestor element
          then infer end tag for this element
        */
        if (node->type == EndTag)
        {
            if ( nodeIsFORM(node) )
            {
                BadForm( doc );
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node );
                continue;
            }

            if (TY_(nodeHasCM)(node,CM_INLINE))
            {
                TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
                TY_(PopInline)( doc, node );
                TY_(FreeNode)( doc, node);
                continue;
            }

            for ( parent = list->parent;
                  parent != NULL; parent = parent->parent )
            {
               /* Do not match across BODY to avoid infinite loop
                  between ParseBody and this parser,
                  See http://tidy.sf.net/bug/1053626. */
                if (nodeIsBODY(parent))
                    break;
                if (node->tag == parent->tag)
                {
                    TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                    TY_(UngetToken)( doc );
                    DEBUG_LOG_EXIT;
                    return NULL;
                }
            }

            TY_(Report)(doc, list, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( !nodeIsLI(node) && nodeisOL )
        {
            /* Issue #572 - A <ol><li> can have nested <ol> elements */
            foundLI = FindLastLI(list, &lastli); /* find last <li> */
        }

        if ( nodeIsLI(node) || (TY_(IsHTML5Mode)(doc) && !foundLI) )
        {
            /* node is <LI> OR
               Issue #396 - A <ul> can have Zero or more <li> elements
             */
            TY_(InsertNodeAtEnd)(list,node);
        }
        else
        {
            TY_(UngetToken)( doc );

            if (TY_(nodeHasCM)(node,CM_BLOCK) && lexer->excludeBlocks)
            {
                TY_(Report)(doc, list, node, MISSING_ENDTAG_BEFORE);
                DEBUG_LOG_EXIT;
                return NULL;
            }
            /* http://tidy.sf.net/issue/1316307 */
            /* In exiled mode, return so table processing can continue. */
            else if ( lexer->exiled
                      && (TY_(nodeHasCM)(node, CM_TABLE|CM_ROWGRP|CM_ROW)
                          || nodeIsTABLE(node)) )
            {
                DEBUG_LOG_EXIT;
                return NULL;
            }
            /* http://tidy.sf.net/issue/836462
               If "list" is an unordered list, insert the next tag within
               the last <li> to preserve the numbering to match the visual
               rendering of most browsers. */
            if ( nodeIsOL(list) && FindLastLI(list, &lastli) )
            {
                /* Create a node for error reporting */
                node = TY_(InferredTag)(doc, TidyTag_LI);
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(FreeNode)( doc, node);
                node = lastli;
            }
            else
            {
                /* Add an inferred <li> */
                wasblock = TY_(nodeHasCM)(node,CM_BLOCK);
                node = TY_(InferredTag)(doc, TidyTag_LI);
                /* Add "display: inline" to avoid a blank line after <li> with
                   Internet Explorer. See http://tidy.sf.net/issue/836462 */
                TY_(AddStyleProperty)( doc, node,
                                       wasblock
                                       ? "list-style: none; display: inline"
                                       : "list-style: none"
                                       );
                TY_(Report)(doc, list, node, MISSING_STARTTAG );
                TY_(InsertNodeAtEnd)(list,node);
            }
        }

        {
            TidyParserMemory memory = {0};
            memory.identity = TY_(ParseList);
            memory.original_node = list;
            memory.reentry_node = node;
            memory.mode = IgnoreWhitespace;
            TY_(pushMemory)( doc, memory );
            DEBUG_LOG_EXIT_WITH_NODE(node);
            return node;
        }
    }

    TY_(Report)(doc, list, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}